

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O0

QList<QLoggingRule> * loadRulesFromFile(QString *filePath)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  uint uVar3;
  char *pcVar4;
  qsizetype qVar5;
  int __oflag;
  QLoggingSettingsParser *in_RDI;
  long in_FS_OFFSET;
  QLoggingSettingsParser parser;
  QTextStream stream;
  QFile file;
  QLoggingSettingsParser *in_stack_fffffffffffffec8;
  enum_type in_stack_fffffffffffffed0;
  enum_type in_stack_fffffffffffffed4;
  int line;
  char *in_stack_fffffffffffffed8;
  undefined1 **file_00;
  QMessageLogger *in_stack_fffffffffffffee0;
  QMessageLogger *this;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QFile *in_stack_fffffffffffffef0;
  QLoggingSettingsParser *this_00;
  QList<QLoggingRule> local_d0;
  QMessageLogger local_b8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  char *pcStack_60;
  QFile local_58 [2];
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = qtLoggingDebug();
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
               &in_stack_fffffffffffffec8->m_inRulesSection,(char *)0x2d5318);
    in_stack_fffffffffffffef0 = local_58;
    QDir::toNativeSeparators((QString *)in_stack_fffffffffffffec8);
    QString::toUtf8((QString *)in_stack_fffffffffffffec8);
    pcVar4 = QByteArray::constData((QByteArray *)0x2d5350);
    QMessageLogger::debug(&local_28,"Checking \"%s\" for rules",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x2d5378);
    QString::~QString((QString *)0x2d5385);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  this = (QMessageLogger *)&local_68;
  QFile::QFile(in_stack_fffffffffffffef0,
               (QString *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QVar2 = operator|(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  uVar3 = QFile::open((QFile *)this,
                      (char *)(ulong)(uint)QVar2.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                      __oflag);
  if ((uVar3 & 1) == 0) {
    memset(in_RDI,0,0x18);
    QList<QLoggingRule>::QList((QList<QLoggingRule> *)0x2d55c2);
  }
  else {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)this_00,(QIODevice *)in_RDI);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    file_00 = &local_98;
    QLoggingSettingsParser::QLoggingSettingsParser((QLoggingSettingsParser *)0x2d547c);
    QLoggingSettingsParser::setContent(this_00,(QTextStream *)in_RDI);
    bVar1 = qtLoggingDebug();
    line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (this,(char *)file_00,line,&in_stack_fffffffffffffec8->m_inRulesSection,
                 (char *)0x2d54c3);
      QLoggingSettingsParser::rules(in_stack_fffffffffffffec8);
      qVar5 = QList<QLoggingRule>::size(&local_d0);
      QMessageLogger::debug(&local_b8,"Loaded %td rules",qVar5);
      QList<QLoggingRule>::~QList((QList<QLoggingRule> *)0x2d5508);
    }
    QLoggingSettingsParser::rules(in_stack_fffffffffffffec8);
    QLoggingSettingsParser::~QLoggingSettingsParser((QLoggingSettingsParser *)0x2d557c);
    QTextStream::~QTextStream((QTextStream *)CONCAT44(line,in_stack_fffffffffffffed0));
  }
  QFile::~QFile((QFile *)0x2d55d7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QLoggingRule> *)this_00;
}

Assistant:

static QList<QLoggingRule> loadRulesFromFile(const QString &filePath)
{
    if (qtLoggingDebug()) {
        debugMsg("Checking \"%s\" for rules",
                 QDir::toNativeSeparators(filePath).toUtf8().constData());
    }

    QFile file(filePath);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        QTextStream stream(&file);
        QLoggingSettingsParser parser;
        parser.setContent(stream);
        if (qtLoggingDebug())
            debugMsg("Loaded %td rules", static_cast<ptrdiff_t>(parser.rules().size()));
        return parser.rules();
    }
    return QList<QLoggingRule>();
}